

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O3

IterateResult __thiscall
gl3cts::GPUShader5FloatEncodingTest::iterate(GPUShader5FloatEncodingTest *this)

{
  long lVar1;
  
  GPUShader5ImplicitConversionsTest::testInit(&this->super_GPUShader5ImplicitConversionsTest);
  lVar1 = 0;
  do {
    execute(this,(testCase *)((long)&iterate::test_cases[0].m_expected_value.m_type + lVar1));
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x800);
  tcu::TestContext::setTestResult
            (((this->super_GPUShader5ImplicitConversionsTest).super_TestCase.m_context)->m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5FloatEncodingTest::iterate()
{
	/* Defines data used as u1 and u2 uniforms */
	static const glw::GLfloat floats[4] = { -1.0f, -1234.0f, 1.0f, 1234.0f };
	static const glw::GLint   ints[4]   = { -1, -1234, 1, 1234 };
	static const glw::GLuint  uints[4]  = { 0xffffffff, 0xfffffb2e, 1, 0x4d2 };

	/* Defines tested cases */
	static const testCase test_cases[] = {
		{ /* float >> int - invalid */
		  { Utils::VARIABLE_TYPE_INT, "int", ints },
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  "floatBitsToInt",
		  false },
		{ /* float >> int - valid */
		  { Utils::VARIABLE_TYPE_INT, "int", floats },
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  "floatBitsToInt",
		  true },
		{ /* vec2 >> ivec2 - invalid */
		  { Utils::VARIABLE_TYPE_IVEC2, "ivec2", ints },
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  "floatBitsToInt",
		  false },
		{ /* vec2 >> ivec2 - valid */
		  { Utils::VARIABLE_TYPE_IVEC2, "ivec2", floats },
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  "floatBitsToInt",
		  true },
		{ /* vec3 >> ivec3 - invalid */
		  { Utils::VARIABLE_TYPE_IVEC3, "ivec3", ints },
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  "floatBitsToInt",
		  false },
		{ /* vec3 >> ivec3 - valid */
		  { Utils::VARIABLE_TYPE_IVEC3, "ivec3", floats },
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  "floatBitsToInt",
		  true },
		{ /* vec4 >> ivec4 - invalid */
		  { Utils::VARIABLE_TYPE_IVEC4, "ivec4", ints },
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  "floatBitsToInt",
		  false },
		{ /* vec4 >> ivec4 - valid */
		  { Utils::VARIABLE_TYPE_IVEC4, "ivec4", floats },
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  "floatBitsToInt",
		  true },
		{ /* float >> uint - invalid */
		  { Utils::VARIABLE_TYPE_UINT, "uint", uints },
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  "floatBitsToUint",
		  false },
		{ /* float >> uint - valid */
		  { Utils::VARIABLE_TYPE_UINT, "uint", floats },
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  "floatBitsToUint",
		  true },
		{ /* vec2 >> uvec2 - invalid */
		  { Utils::VARIABLE_TYPE_UVEC2, "uvec2", uints },
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  "floatBitsToUint",
		  false },
		{ /* vec2 >> uvec2 - valid */
		  { Utils::VARIABLE_TYPE_UVEC2, "uvec2", floats },
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  "floatBitsToUint",
		  true },
		{ /* vec3 >> uvec3 - invalid */
		  { Utils::VARIABLE_TYPE_UVEC3, "uvec3", uints },
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  "floatBitsToUint",
		  false },
		{ /* vec3 >> uvec3 - valid */
		  { Utils::VARIABLE_TYPE_UVEC3, "uvec3", floats },
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  "floatBitsToUint",
		  true },
		{ /* vec4 >> ivec4 - invalid */
		  { Utils::VARIABLE_TYPE_UVEC4, "uvec4", uints },
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  "floatBitsToUint",
		  false },
		{ /* vec4 >> uvec4 - valid */
		  { Utils::VARIABLE_TYPE_UVEC4, "uvec4", floats },
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  "floatBitsToUint",
		  true },
		{ /* int >> float - invalid */
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  { Utils::VARIABLE_TYPE_INT, "int", ints },
		  "intBitsToFloat",
		  false },
		{ /* int >> float - valid */
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  { Utils::VARIABLE_TYPE_INT, "int", floats },
		  "intBitsToFloat",
		  true },
		{ /* ivec2 >> vec2 - invalid */
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  { Utils::VARIABLE_TYPE_IVEC2, "ivec2", ints },
		  "intBitsToFloat",
		  false },
		{ /* ivec2 >> vec2 - valid */
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  { Utils::VARIABLE_TYPE_IVEC2, "ivec2", floats },
		  "intBitsToFloat",
		  true },
		{ /* ivec3 >> vec3 - invalid */
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  { Utils::VARIABLE_TYPE_IVEC3, "ivec3", ints },
		  "intBitsToFloat",
		  false },
		{ /* ivec3 >> vec3 - valid */
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  { Utils::VARIABLE_TYPE_IVEC3, "ivec3", floats },
		  "intBitsToFloat",
		  true },
		{ /* ivec4 >> vec4 - invalid */
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  { Utils::VARIABLE_TYPE_IVEC4, "ivec4", ints },
		  "intBitsToFloat",
		  false },
		{ /* ivec4 >> vec4 - valid */
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  { Utils::VARIABLE_TYPE_IVEC4, "ivec4", floats },
		  "intBitsToFloat",
		  true },
		{ /* uint >> float - invalid */
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  { Utils::VARIABLE_TYPE_UINT, "uint", uints },
		  "uintBitsToFloat",
		  false },
		{ /* uint >> float - valid */
		  { Utils::VARIABLE_TYPE_FLOAT, "float", floats },
		  { Utils::VARIABLE_TYPE_UINT, "uint", floats },
		  "uintBitsToFloat",
		  true },
		{ /* uvec2 >> vec2 - invalid */
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  { Utils::VARIABLE_TYPE_UVEC2, "uvec2", uints },
		  "uintBitsToFloat",
		  false },
		{ /* uvec2 >> vec2 - valid */
		  { Utils::VARIABLE_TYPE_VEC2, "vec2", floats },
		  { Utils::VARIABLE_TYPE_UVEC2, "uvec2", floats },
		  "uintBitsToFloat",
		  true },
		{ /* uvec3 >> vec3 - invalid */
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  { Utils::VARIABLE_TYPE_UVEC3, "uvec3", uints },
		  "uintBitsToFloat",
		  false },
		{ /* uvec3 >> vec3 - valid */
		  { Utils::VARIABLE_TYPE_VEC3, "vec3", floats },
		  { Utils::VARIABLE_TYPE_UVEC3, "uvec3", floats },
		  "uintBitsToFloat",
		  true },
		{ /* uvec4 >> vec4 - invalid */
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  { Utils::VARIABLE_TYPE_UVEC4, "uvec4", uints },
		  "uintBitsToFloat",
		  false },
		{ /* uvec4 >> vec4 - valid */
		  { Utils::VARIABLE_TYPE_VEC4, "vec4", floats },
		  { Utils::VARIABLE_TYPE_UVEC4, "uvec4", floats },
		  "uintBitsToFloat",
		  true },
	};
	static const size_t n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	testInit();

	/* Execute test case */
	for (size_t i = 0; i < n_test_cases; ++i)
	{
		const testCase& test_case = test_cases[i];

		execute(test_case);
	}

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}